

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

xmlChar * xmlUTF8Strndup(xmlChar *utf,int len)

{
  int iVar1;
  xmlChar *__dest;
  size_t __n;
  
  if (-1 < len && utf != (xmlChar *)0x0) {
    iVar1 = xmlUTF8Strsize(utf,len);
    __n = (size_t)iVar1;
    __dest = (xmlChar *)(*xmlMallocAtomic)(__n + 1);
    if (__dest != (xmlChar *)0x0) {
      memcpy(__dest,utf,__n);
      __dest[__n] = '\0';
      return __dest;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlUTF8Strndup(const xmlChar *utf, int len) {
    xmlChar *ret;
    int i;

    if ((utf == NULL) || (len < 0)) return(NULL);
    i = xmlUTF8Strsize(utf, len);
    ret = (xmlChar *) xmlMallocAtomic((size_t) i + 1);
    if (ret == NULL) {
        return(NULL);
    }
    memcpy(ret, utf, i);
    ret[i] = 0;
    return(ret);
}